

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::microfacet::g2(microfacet *this,vec3 *wm,vec3 *wi,vec3 *wo,args *args)

{
  float fVar1;
  float_t fVar2;
  float_t fVar3;
  float_t sigma_o;
  float_t sigma_i;
  float_t zizo;
  args *args_local;
  vec3 *wo_local;
  vec3 *wi_local;
  vec3 *wm_local;
  microfacet *this_local;
  
  if (((wm->z <= 0.0) || (wi->z <= 0.0)) || (wo->z <= 0.0)) {
    this_local._4_4_ = 0.0;
  }
  else {
    fVar1 = wi->z * wo->z;
    fVar2 = sigma(this,wi,args);
    fVar3 = sigma(this,wo,args);
    this_local._4_4_ = fVar1 / ((fVar2 * wo->z + fVar3 * wi->z) - fVar1);
  }
  return this_local._4_4_;
}

Assistant:

float_t
microfacet::g2(
	const vec3 &wm,
	const vec3 &wi,
	const vec3 &wo,
	const args &args
) const {
	if (wm.z > 0 && wi.z > 0 && wo.z > 0) {
		float_t zizo = wi.z * wo.z;
		float_t sigma_i = sigma(wi, args);
		float_t sigma_o = sigma(wo, args);
		return zizo / (sigma_i * wo.z + sigma_o * wi.z - zizo);
	}
	return 0;
}